

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O0

void process_expression(CompilerState *compiler_state,AstNode *node)

{
  AstNode *node_local;
  CompilerState *compiler_state_local;
  
  switch(node->type) {
  case EXPR_LITERAL:
    break;
  case EXPR_SYMBOL:
    break;
  case EXPR_Y_INDEX:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    break;
  case EXPR_FIELD_SELECTOR:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    break;
  case EXPR_TABLE_ELEMENT_ASSIGN:
    if ((node->field_2).function_stmt.function_expr != (AstNode *)0x0) {
      process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    }
    process_expression(compiler_state,(node->field_2).binary_expr.expr_right);
    break;
  case EXPR_SUFFIXED:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    if ((node->field_2).for_stmt.for_statement_list != (AstNodeList *)0x0) {
      process_expression_list(compiler_state,(node->field_2).for_stmt.for_statement_list);
    }
    break;
  case EXPR_UNARY:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    break;
  case EXPR_BINARY:
    process_expression(compiler_state,(node->field_2).function_stmt.function_expr);
    process_expression(compiler_state,(node->field_2).binary_expr.expr_right);
    break;
  case EXPR_FUNCTION:
    process_statement_list(compiler_state,(node->field_2).function_expr.function_statement_list);
    break;
  case EXPR_TABLE_LITERAL:
    process_expression_list(compiler_state,(node->field_2).table_expr.expr_list);
    break;
  case EXPR_FUNCTION_CALL:
    process_expression_list(compiler_state,(node->field_2).for_stmt.for_statement_list);
    break;
  case EXPR_CONCAT:
    process_expression_list(compiler_state,(node->field_2).table_expr.expr_list);
    break;
  case EXPR_BUILTIN:
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_lower.c"
                  ,0x56,"void process_expression(CompilerState *, AstNode *)");
  }
  return;
}

Assistant:

static void process_expression(CompilerState *compiler_state, AstNode *node)
{
	switch (node->type) {
	case EXPR_FUNCTION:
		process_statement_list(compiler_state, node->function_expr.function_statement_list);
		break;
	case EXPR_SUFFIXED:
		process_expression(compiler_state, node->suffixed_expr.primary_expr);
		if (node->suffixed_expr.suffix_list) {
			process_expression_list(compiler_state, node->suffixed_expr.suffix_list);
		} else {
			// We can simplify and get rid of the suffixed expr
			// TODO free primary_expr
			memcpy(node, node->suffixed_expr.primary_expr, sizeof(AstNode));
		}
		break;
	case EXPR_FUNCTION_CALL:
		process_expression_list(compiler_state, node->function_call_expr.arg_list);
		break;
	case EXPR_SYMBOL:
		break;
	case EXPR_BINARY:
		if (node->binary_expr.binary_op == BINOPR_CONCAT) {
			flatten_concat_expression(compiler_state, node);
			goto L_string_concat;
		}
		process_expression(compiler_state, node->binary_expr.expr_left);
		process_expression(compiler_state, node->binary_expr.expr_right);
		if (node->binary_expr.expr_left->type == EXPR_LITERAL &&
		    node->binary_expr.expr_right->type == EXPR_LITERAL && 
			node->binary_expr.binary_op >= BINOPR_ADD &&
			node->binary_expr.binary_op <= BINOPR_SHR) {
			LiteralExpression result = { { RAVI_TANY } };
			if (luaO_rawarith(compiler_state, node->binary_expr.binary_op,
					  &node->binary_expr.expr_left->literal_expr,
					  &node->binary_expr.expr_right->literal_expr, &result)) {
				node->type = EXPR_LITERAL;
				node->literal_expr.type.type_code = result.type.type_code;
				if (node->literal_expr.type.type_code == RAVI_TNUMFLT)
					node->literal_expr.u.r = result.u.r;
				else {
					assert(node->literal_expr.type.type_code == RAVI_TNUMINT);
					node->literal_expr.u.i = result.u.i;
				}
				// TODO free expr_left and expr_right
			}
		}
		break;
	case EXPR_CONCAT:
	L_string_concat:
		process_expression_list(compiler_state, node->string_concatenation_expr.expr_list);
		break;
	case EXPR_UNARY:
		process_expression(compiler_state, node->unary_expr.expr);
		if (node->unary_expr.expr->type == EXPR_LITERAL && 
			(node->unary_expr.unary_op == UNOPR_BNOT || node->unary_expr.unary_op == UNOPR_MINUS)) {
			LiteralExpression result = { { RAVI_TANY } };
			if (luaO_rawarith(compiler_state, node->unary_expr.unary_op, &node->unary_expr.expr->literal_expr,
					  &node->unary_expr.expr->literal_expr, &result)) {
				node->type = EXPR_LITERAL;
				node->literal_expr.type.type_code = result.type.type_code;
				if (node->literal_expr.type.type_code == RAVI_TNUMFLT)
					node->literal_expr.u.r = result.u.r;
				else {
					assert(node->literal_expr.type.type_code == RAVI_TNUMINT);
					node->literal_expr.u.i = result.u.i;
				}
				// TODO free unary_expr.expr
			}
		}
		break;
	case EXPR_LITERAL:
		break;
	case EXPR_FIELD_SELECTOR:
		process_expression(compiler_state, node->index_expr.expr);
		break;
	case EXPR_Y_INDEX:
		process_expression(compiler_state, node->index_expr.expr);
		break;
	case EXPR_TABLE_ELEMENT_ASSIGN:
		if (node->table_elem_assign_expr.key_expr) {
			process_expression(compiler_state, node->table_elem_assign_expr.key_expr);
		}
		process_expression(compiler_state, node->table_elem_assign_expr.value_expr);
		break;
	case EXPR_TABLE_LITERAL:
		process_expression_list(compiler_state, node->table_expr.expr_list);
		break;
	case EXPR_BUILTIN:
		break;
	default:
		assert(0);
		break;
	}
}